

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::isRootMetadata(QPDFObjectHandle *this)

{
  bool bVar1;
  QPDFObjectHandle local_20;
  QPDFObjectHandle *local_10;
  QPDFObjectHandle *this_local;
  
  local_10 = this;
  as_stream(&local_20,(typed)this);
  bVar1 = ::qpdf::Stream::isRootMetadata((Stream *)&local_20);
  ::qpdf::Stream::~Stream((Stream *)&local_20);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::isRootMetadata() const
{
    return as_stream(error).isRootMetadata();
}